

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# python_generator.cc
# Opt level: O1

void __thiscall
google::protobuf::compiler::python::Generator::PrintServiceDescriptors(Generator *this)

{
  FileDescriptor *pFVar1;
  long lVar2;
  long lVar3;
  
  pFVar1 = this->file_;
  if (0 < *(int *)(pFVar1 + 0x34)) {
    lVar3 = 0;
    lVar2 = 0;
    do {
      PrintServiceDescriptor(this,(ServiceDescriptor *)(*(long *)(pFVar1 + 0x78) + lVar3));
      AddServiceToFileDescriptor(this,(ServiceDescriptor *)(*(long *)(this->file_ + 0x78) + lVar3));
      io::Printer::Print<>(this->printer_,"\n");
      lVar2 = lVar2 + 1;
      pFVar1 = this->file_;
      lVar3 = lVar3 + 0x30;
    } while (lVar2 < *(int *)(pFVar1 + 0x34));
  }
  return;
}

Assistant:

void Generator::PrintServiceDescriptors() const {
  for (int i = 0; i < file_->service_count(); ++i) {
    PrintServiceDescriptor(*file_->service(i));
    AddServiceToFileDescriptor(*file_->service(i));
    printer_->Print("\n");
  }
}